

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

Task * AI::create_Wait(Task *__return_storage_ptr__,float time)

{
  _func_void__Any_data_ptr_Task_ptr_WorldState_ptr_WorldQuerier_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _Any_data __tmp;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  string local_48;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"wait","");
  Task::Task(__return_storage_ptr__,&local_48,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->action = Wait;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::resize
            (&(__return_storage_ptr__->parameters).vectors,1);
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_68._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(__return_storage_ptr__->setup).super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8);
  *(float *)&(__return_storage_ptr__->setup).super__Function_base._M_functor = time;
  *(undefined4 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 4) = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 0xc) = 0;
  local_58 = (__return_storage_ptr__->setup).super__Function_base._M_manager;
  (__return_storage_ptr__->setup).super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:55:16)>
       ::_M_manager;
  p_Stack_50 = (__return_storage_ptr__->setup)._M_invoker;
  (__return_storage_ptr__->setup)._M_invoker =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:55:16)>
       ::_M_invoke;
  local_28 = time;
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_68._M_unused._M_member_pointer = 3;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(__return_storage_ptr__->postconditions).satisfiedPredicates,
             (SatisfiablePredicateParams *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Task create_Wait(float time)
	{
		Task wait {"wait"};		
		wait.action = Action::Wait;
		wait.parameters.vectors.resize(1);
		wait.setup = [=](Task& task, const WorldState& state, const WorldQuerier&)
		{
			//parameters.vectors[0] is {current alarm time, total alarm time, UNUSED}
			task.parameters.vectors[0].x = 0;
			task.parameters.vectors[0].y = time;
		};
		
		wait.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed, 0});

		return wait;
	}